

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

int av1_get_intra_cost_penalty(int qindex,int qdelta,aom_bit_depth_t bit_depth)

{
  int16_t iVar1;
  int iVar2;
  
  iVar1 = av1_dc_quant_QTX(qindex,qdelta,bit_depth);
  iVar2 = (int)iVar1;
  if (bit_depth == AOM_BITS_12) {
    iVar2 = iVar2 * 5 + 2 >> 2;
  }
  else if (bit_depth == AOM_BITS_10) {
    iVar2 = iVar2 * 5;
  }
  else if (bit_depth == AOM_BITS_8) {
    iVar2 = iVar2 * 0x14;
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int av1_get_intra_cost_penalty(int qindex, int qdelta,
                               aom_bit_depth_t bit_depth) {
  const int q = av1_dc_quant_QTX(qindex, qdelta, bit_depth);
  switch (bit_depth) {
    case AOM_BITS_8: return 20 * q;
    case AOM_BITS_10: return 5 * q;
    case AOM_BITS_12: return ROUND_POWER_OF_TWO(5 * q, 2);
    default:
      assert(0 && "bit_depth should be AOM_BITS_8, AOM_BITS_10 or AOM_BITS_12");
      return -1;
  }
}